

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_class.cpp
# Opt level: O2

void Omega_h::classify_equal_order(Mesh *mesh,Int ent_dim,LOs *eqv2v,Read<int> *eq_class_ids)

{
  Omega_h_Family family;
  Alloc *pAVar1;
  Int IVar2;
  LO LVar3;
  size_t sVar4;
  Read<signed_char> eq_class_dim;
  Read<signed_char> class_dim;
  Write<int> local_148;
  Read<int> class_id;
  Adj v2e;
  Write<int> local_f8;
  Write<int> local_e8;
  Write<signed_char> local_d8;
  Write<int> local_c8;
  Write<int> local_b8;
  Write<int> local_a8;
  Write<signed_char> local_98;
  Write<int> local_88;
  Write<int> local_78;
  Write<int> local_68;
  Adj local_58;
  
  local_148.shared_alloc_.alloc = (Alloc *)0x0;
  local_148.shared_alloc_.direct_ptr = (void *)0x0;
  IVar2 = Mesh::dim(mesh);
  if (IVar2 == ent_dim) {
    LVar3 = Mesh::nelems(mesh);
    std::__cxx11::string::string((string *)&v2e,"",(allocator *)&class_dim);
    Read<int>::Read((Read<int> *)&eq_class_dim,LVar3,0,1,(string *)&v2e);
    Write<int>::operator=(&local_148,(Write<int> *)&eq_class_dim);
    Write<int>::~Write((Write<int> *)&eq_class_dim);
    std::__cxx11::string::~string((string *)&v2e);
  }
  else if (ent_dim == 0) {
    Write<int>::operator=(&local_148,&eqv2v->write_);
  }
  else {
    eq_class_dim.write_.shared_alloc_.alloc = (Alloc *)0x0;
    eq_class_dim.write_.shared_alloc_.direct_ptr = (void *)0x0;
    class_dim.write_.shared_alloc_.alloc = (Alloc *)0x0;
    class_dim.write_.shared_alloc_.direct_ptr = (void *)0x0;
    Mesh::ask_verts_of((Mesh *)&class_id,(Int)mesh);
    Mesh::ask_up(&v2e,mesh,0,ent_dim);
    family = mesh->family_;
    Write<int>::Write(&local_68,&eqv2v->write_);
    Write<int>::Write(&local_78,&class_id.write_);
    Adj::Adj(&local_58,&v2e);
    find_matches(family,ent_dim,(LOs *)&local_68,(LOs *)&local_78,&local_58,
                 (Write<int> *)&eq_class_dim,&class_dim.write_);
    Adj::~Adj(&local_58);
    Write<int>::~Write(&local_78);
    Write<int>::~Write(&local_68);
    Write<int>::Write(&local_88,(Write<int> *)&eq_class_dim);
    Read<int>::Read((Read<signed_char> *)&local_f8,&local_88);
    Write<int>::operator=(&local_148,&local_f8);
    Write<int>::~Write(&local_f8);
    Write<int>::~Write(&local_88);
    Adj::~Adj(&v2e);
    Write<int>::~Write(&class_id.write_);
    Write<signed_char>::~Write(&class_dim.write_);
    Write<int>::~Write((Write<int> *)&eq_class_dim);
  }
  pAVar1 = (eqv2v->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar4 = pAVar1->size;
  }
  else {
    sVar4 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&v2e,"",(allocator *)&class_dim);
  Read<signed_char>::Read
            (&eq_class_dim,
             (LO)((long)((ulong)(uint)((int)(sVar4 >> 2) >> 0x1f) << 0x20 | sVar4 >> 2 & 0xffffffff)
                 / (long)(ent_dim + 1)),(char)ent_dim,(string *)&v2e);
  std::__cxx11::string::~string((string *)&v2e);
  Write<signed_char>::Write(&local_98,&eq_class_dim.write_);
  Write<int>::Write(&local_a8,&local_148);
  LVar3 = Mesh::nents(mesh,ent_dim);
  IVar2 = Mesh::dim(mesh);
  map_onto<signed_char>
            ((Omega_h *)&class_dim,(Read<signed_char> *)&local_98,(LOs *)&local_a8,LVar3,(char)IVar2
             ,1);
  Write<int>::~Write(&local_a8);
  Write<signed_char>::~Write(&local_98);
  Write<int>::Write(&local_b8,&eq_class_ids->write_);
  Write<int>::Write(&local_c8,&local_148);
  LVar3 = Mesh::nents(mesh,ent_dim);
  map_onto<int>((Omega_h *)&class_id,(Read<int> *)&local_b8,(LOs *)&local_c8,LVar3,-1,1);
  Write<int>::~Write(&local_c8);
  Write<int>::~Write(&local_b8);
  std::__cxx11::string::string((string *)&v2e,"class_dim",(allocator *)&local_f8);
  Write<signed_char>::Write(&local_d8,&class_dim.write_);
  Mesh::add_tag<signed_char>(mesh,ent_dim,(string *)&v2e,1,(Read<signed_char> *)&local_d8,false);
  Write<signed_char>::~Write(&local_d8);
  std::__cxx11::string::~string((string *)&v2e);
  std::__cxx11::string::string((string *)&v2e,"class_id",(allocator *)&local_f8);
  Write<int>::Write(&local_e8,&class_id.write_);
  Mesh::add_tag<int>(mesh,ent_dim,(string *)&v2e,1,(Read<int> *)&local_e8,false);
  Write<int>::~Write(&local_e8);
  std::__cxx11::string::~string((string *)&v2e);
  Write<int>::~Write(&class_id.write_);
  Write<signed_char>::~Write(&class_dim.write_);
  Write<signed_char>::~Write(&eq_class_dim.write_);
  Write<int>::~Write(&local_148);
  return;
}

Assistant:

void classify_equal_order(
    Mesh* mesh, Int ent_dim, LOs eqv2v, Read<ClassId> eq_class_ids) {
  LOs eq2e;
  if (ent_dim == mesh->dim()) {
    /* assuming elements were constructed in the same order ! */
    eq2e = LOs(mesh->nelems(), 0, 1);
  } else if (ent_dim == VERT) {
    eq2e = eqv2v;
  } else {
    Write<LO> eq2e_w;
    Write<I8> codes;
    auto ev2v = mesh->ask_verts_of(ent_dim);
    auto v2e = mesh->ask_up(VERT, ent_dim);
    find_matches(mesh->family(), ent_dim, eqv2v, ev2v, v2e, &eq2e_w, &codes);
    eq2e = eq2e_w;
  }
  auto neq = eqv2v.size() / (ent_dim + 1);
  auto eq_class_dim = Read<I8>(neq, I8(ent_dim));
  auto class_dim =
      map_onto(eq_class_dim, eq2e, mesh->nents(ent_dim), I8(mesh->dim()), 1);
  auto class_id = map_onto(eq_class_ids, eq2e, mesh->nents(ent_dim), -1, 1);
  mesh->add_tag<I8>(ent_dim, "class_dim", 1, class_dim);
  mesh->add_tag<ClassId>(ent_dim, "class_id", 1, class_id);
}